

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O2

string * __thiscall
V4L2Device::make_jpeg_file_name_abi_cxx11_(string *__return_storage_ptr__,V4L2Device *this)

{
  bool bVar1;
  Options *pOVar2;
  int iVar3;
  OptionDetails *pOVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  bool *pbVar6;
  tm *ptVar7;
  Writer *this_00;
  size_t sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmpl;
  time_t t;
  Writer local_10d0;
  tm lt;
  char name [4096];
  
  pOVar2 = (this->options).super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_10d0,"result",(allocator *)&lt);
  pOVar4 = cxxopts::Options::operator[](pOVar2,(string *)&local_10d0);
  pbVar5 = cxxopts::OptionDetails::as<std::__cxx11::string>(pOVar4);
  std::__cxx11::string::string((string *)&tmpl,(string *)pbVar5);
  std::__cxx11::string::~string((string *)&local_10d0);
  pOVar2 = (this->options).super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_10d0,"strftime",(allocator *)&lt);
  pOVar4 = cxxopts::Options::operator[](pOVar2,(string *)&local_10d0);
  pbVar6 = cxxopts::OptionDetails::as<bool>(pOVar4);
  bVar1 = *pbVar6;
  std::__cxx11::string::~string((string *)&local_10d0);
  if (bVar1 == true) {
    t = time((time_t *)0x0);
    ptVar7 = localtime_r(&t,(tm *)&lt);
    if (ptVar7 == (tm *)0x0) {
      local_10d0._vptr_Writer = (_func_int **)&PTR__Writer_00176078;
      local_10d0.m_level = Error;
      local_10d0.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
      ;
      local_10d0.m_line = 0x1af;
      local_10d0.m_func = "std::string V4L2Device::make_jpeg_file_name()";
      local_10d0.m_verboseLevel = 0;
      local_10d0.m_logger = (Logger *)0x0;
      local_10d0.m_proceed = false;
      local_10d0.m_messageBuilder.m_logger = (Logger *)0x0;
      local_10d0.m_messageBuilder.m_containerLogSeperator = "";
      local_10d0.m_dispatchAction = NormalLog;
      local_10d0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_10d0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_10d0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = el::base::Writer::construct(&local_10d0,1,"default");
      el::base::Writer::operator<<(this_00,(char (*) [21])"localtime_r() failed");
      el::base::Writer::~Writer(&local_10d0);
    }
    sVar8 = strftime(name,0xfff,tmpl._M_dataplus._M_p,(tm *)&lt);
    iVar3 = (int)sVar8;
  }
  else {
    iVar3 = snprintf(name,0xfff,tmpl._M_dataplus._M_p,(ulong)(uint)this->frames_taken);
  }
  if (iVar3 < 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,name,(allocator *)&local_10d0);
  }
  std::__cxx11::string::~string((string *)&tmpl);
  return __return_storage_ptr__;
}

Assistant:

std::string
    make_jpeg_file_name()
    {
        char name[PATH_MAX];
        int rc = 0;

        auto tmpl = (*options)["result"].as<std::string>();

        auto use_strftime = (*options)["strftime"].as<bool>();
        if (use_strftime) {
            struct tm lt;
            auto t = std::time(nullptr);
            if (localtime_r(&t, &lt) == nullptr) {
                LOG(ERROR) << "localtime_r() failed";
            }
            rc = strftime(name, sizeof(name) - 1, tmpl.c_str(), &lt);
        } else {
            rc = snprintf(name, sizeof(name) - 1, tmpl.c_str(), frames_taken);
        }

        return (rc > 0 ? std::string(name) : std::string());
    }